

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetType.cpp
# Opt level: O0

void __thiscall
slang::ast::NetType::NetType(NetType *this,NetKind netKind,string_view name,Type *dataType)

{
  string_view name_00;
  char *in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  DeclaredType *in_RDI;
  Type *in_R8;
  void **in_stack_ffffffffffffff98;
  DeclaredType *parent;
  undefined8 in_stack_ffffffffffffffb0;
  bitmask<slang::ast::DeclaredTypeFlags> flags;
  bitmask<slang::ast::DeclaredTypeFlags> local_44;
  SourceLocation local_40;
  size_t local_38;
  char *local_30;
  Type *local_28;
  undefined4 local_1c;
  
  flags.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_38 = in_RDX;
  local_30 = in_RCX;
  local_28 = in_R8;
  local_1c = in_ESI;
  SourceLocation::SourceLocation(&local_40);
  name_00._M_str = local_30;
  name_00._M_len = local_38;
  Symbol::Symbol((Symbol *)in_RDI,NetType,name_00,local_40);
  parent = in_RDI + 1;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_44,None);
  DeclaredType::DeclaredType(in_RDI,(Symbol *)parent,flags);
  *(undefined4 *)&in_RDI[2].parent = local_1c;
  std::optional<const_slang::ast::SubroutineSymbol_*>::optional
            ((optional<const_slang::ast::SubroutineSymbol_*> *)0x58635a);
  DeclaredType::setType(in_RDI + 1,local_28);
  std::optional<slang::ast::SubroutineSymbol_const*>::operator=
            ((optional<const_slang::ast::SubroutineSymbol_*> *)parent,in_stack_ffffffffffffff98);
  return;
}

Assistant:

NetType::NetType(NetKind netKind, std::string_view name, const Type& dataType) :
    Symbol(SymbolKind::NetType, name, SourceLocation()), declaredType(*this), netKind(netKind) {
    declaredType.setType(dataType);
    resolver = nullptr;
}